

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *this,int num_values,
          int num_items,DblSuffixHandler *handler)

{
  if (0 < num_values) {
    do {
      NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadUInt
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)this,num_items);
      TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
      TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
      num_values = num_values + -1;
    } while (num_values != 0);
  }
  return;
}

Assistant:

void ReadSuffixValues(int num_values, int num_items, SuffixHandler &handler) {
    ValueReader read;
    for (int i = 0; i < num_values; ++i) {
      int index = ReadUInt(num_items);
      handler.SetValue(index, read(reader_));
      reader_.ReadTillEndOfLine();
    }
  }